

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

Instrument * __thiscall
SFFile::LoadInstrumentOrder(SFFile *this,Renderer *song,int order,int drum,int bank,int program)

{
  uint uVar1;
  SFPerc *pSVar2;
  Instrument *pIVar3;
  int local_38;
  uint local_34;
  int i_1;
  uint i;
  int program_local;
  int bank_local;
  int drum_local;
  int order_local;
  Renderer *song_local;
  SFFile *this_local;
  
  if (drum == 0) {
    for (local_38 = 0; local_38 < this->NumPresets + -1; local_38 = local_38 + 1) {
      if ((((order < 0) || ((uint)(this->Presets[local_38].field_0x15 & 0x7f) == order)) &&
          ((uint)this->Presets[local_38].Bank == bank)) &&
         ((uint)this->Presets[local_38].Program == program)) {
        pIVar3 = LoadPreset(this,song,this->Presets + local_38);
        return pIVar3;
      }
    }
  }
  else {
    for (local_34 = 0; uVar1 = TArray<SFPerc,_SFPerc>::Size(&this->Percussion), local_34 < uVar1;
        local_34 = local_34 + 1) {
      if (((order < 0) ||
          (pSVar2 = TArray<SFPerc,_SFPerc>::operator[](&this->Percussion,(ulong)local_34),
          (uint)pSVar2->LoadOrder == order)) &&
         ((pSVar2 = TArray<SFPerc,_SFPerc>::operator[](&this->Percussion,(ulong)local_34),
          (uint)(pSVar2->Generators).field_0.keyRange.Lo == bank &&
          (pSVar2 = TArray<SFPerc,_SFPerc>::operator[](&this->Percussion,(ulong)local_34),
          (uint)(pSVar2->Generators).field_0.keyRange.Hi == program)))) {
        pSVar2 = TArray<SFPerc,_SFPerc>::operator[](&this->Percussion,(ulong)local_34);
        pIVar3 = LoadPercussion(this,song,pSVar2);
        return pIVar3;
      }
    }
  }
  return (Instrument *)0x0;
}

Assistant:

Instrument *SFFile::LoadInstrumentOrder(Renderer *song, int order, int drum, int bank, int program)
{
	if (drum)
	{
		for (unsigned int i = 0; i < Percussion.Size(); ++i)
		{
			if ((order < 0 || Percussion[i].LoadOrder == order) &&
				Percussion[i].Generators.drumset == bank &&
				Percussion[i].Generators.key == program)
			{
				return LoadPercussion(song, &Percussion[i]);
			}
		}
	}
	else
	{
		for (int i = 0; i < NumPresets - 1; ++i)
		{
			if ((order < 0 || Presets[i].LoadOrder == order) &&
				Presets[i].Bank == bank &&
				Presets[i].Program == program)
			{
				return LoadPreset(song, &Presets[i]);
			}
		}
	}
	return NULL;
}